

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateRecorder::Impl::copy_specialization_info
          (Impl *this,VkSpecializationInfo *info,ScratchAllocator *alloc,
          VkSpecializationInfo **out_info)

{
  VkSpecializationInfo *pVVar1;
  VkSpecializationMapEntry *pVVar2;
  uchar *puVar3;
  
  pVVar1 = copy<VkSpecializationInfo>(this,info,1,alloc);
  pVVar2 = copy<VkSpecializationMapEntry>
                     (this,pVVar1->pMapEntries,(ulong)pVVar1->mapEntryCount,alloc);
  pVVar1->pMapEntries = pVVar2;
  puVar3 = copy<unsigned_char>(this,(uchar *)pVVar1->pData,pVVar1->dataSize,alloc);
  pVVar1->pData = puVar3;
  *out_info = pVVar1;
  return true;
}

Assistant:

bool StateRecorder::Impl::copy_specialization_info(const VkSpecializationInfo *info, ScratchAllocator &alloc,
                                                   const VkSpecializationInfo **out_info)
{
	auto *ret = copy(info, 1, alloc);
	ret->pMapEntries = copy(ret->pMapEntries, ret->mapEntryCount, alloc);
	ret->pData = copy(static_cast<const uint8_t *>(ret->pData), ret->dataSize, alloc);

	*out_info = ret;
	return true;
}